

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imsg-buffer.c
# Opt level: O0

int ibuf_realloc(ibuf *buf,size_t len)

{
  int *piVar1;
  void *pvVar2;
  long in_RSI;
  long in_RDI;
  u_char *b;
  undefined4 local_4;
  
  if (*(ulong *)(in_RDI + 0x20) < (ulong)(*(long *)(in_RDI + 0x28) + in_RSI)) {
    piVar1 = __errno_location();
    *piVar1 = 0xc;
    local_4 = -1;
  }
  else {
    pvVar2 = realloc(*(void **)(in_RDI + 0x10),*(long *)(in_RDI + 0x28) + in_RSI);
    if (pvVar2 == (void *)0x0) {
      local_4 = -1;
    }
    else {
      *(void **)(in_RDI + 0x10) = pvVar2;
      *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x28) + in_RSI;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int
ibuf_realloc(struct ibuf *buf, size_t len)
{
	u_char	*b;

	/* on static buffers max is eq size and so the following fails */
	if (buf->wpos + len > buf->max) {
		errno = ENOMEM;
		return (-1);
	}

	b = realloc(buf->buf, buf->wpos + len);
	if (b == NULL)
		return (-1);
	buf->buf = b;
	buf->size = buf->wpos + len;

	return (0);
}